

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

CeilLayerParams * __thiscall
CoreML::Specification::CeilLayerParams::New(CeilLayerParams *this,Arena *arena)

{
  CeilLayerParams *this_00;
  
  this_00 = (CeilLayerParams *)operator_new(0x18);
  CeilLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CeilLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

CeilLayerParams* CeilLayerParams::New(::google::protobuf::Arena* arena) const {
  CeilLayerParams* n = new CeilLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}